

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

Matrix<float,_3,_2> * __thiscall
deqp::gles3::Functional::MatrixCaseUtils::outerProduct<float,2,3>
          (Matrix<float,_3,_2> *__return_storage_ptr__,MatrixCaseUtils *this,Vector<float,_3> *a,
          Vector<float,_2> *b)

{
  float *pfVar1;
  Vector<float,_3> *pVVar2;
  Matrix<float,_3,_2> *res;
  float *pfVar3;
  bool bVar4;
  int col;
  long lVar5;
  int c;
  long lVar6;
  undefined1 auVar7 [16];
  bool bVar9;
  float fVar10;
  float afStack_28 [2];
  Matrix<float,_2,_3> retVal;
  long lVar8;
  
  pfVar1 = afStack_28 + 1;
  afStack_28[0] = 0.0;
  afStack_28[1] = 0.0;
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  retVal.m_data.m_data[0].m_data[1] = 0.0;
  retVal.m_data.m_data[1].m_data[0] = 0.0;
  retVal.m_data.m_data[1].m_data[1] = 0.0;
  lVar5 = 0;
  pfVar3 = afStack_28;
  bVar9 = true;
  do {
    bVar4 = bVar9;
    lVar6 = 0;
    auVar7 = _DAT_019fcc00;
    do {
      bVar9 = SUB164(auVar7 ^ _DAT_019f5ce0,4) == -0x80000000 &&
              SUB164(auVar7 ^ _DAT_019f5ce0,0) < -0x7ffffffd;
      if (bVar9) {
        fVar10 = 1.0;
        if (lVar5 != lVar6) {
          fVar10 = 0.0;
        }
        pfVar3[lVar6 * 2] = fVar10;
      }
      if (bVar9) {
        fVar10 = 1.0;
        if (lVar5 + -1 != lVar6) {
          fVar10 = 0.0;
        }
        pfVar3[(lVar6 + 1) * 2] = fVar10;
      }
      lVar6 = lVar6 + 2;
      lVar8 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 2;
      auVar7._8_8_ = lVar8 + 2;
    } while (lVar6 != 4);
    lVar5 = 1;
    pfVar3 = pfVar1;
    bVar9 = false;
  } while (bVar4);
  lVar5 = 0;
  pfVar3 = afStack_28;
  bVar9 = true;
  do {
    bVar4 = bVar9;
    fVar10 = a->m_data[lVar5];
    lVar5 = 0;
    do {
      pfVar3[lVar5 * 2] = *(float *)(this + lVar5 * 4) * fVar10;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    lVar5 = 1;
    pfVar3 = pfVar1;
    bVar9 = false;
  } while (bVar4);
  (__return_storage_ptr__->m_data).m_data[0] = (float  [3])0x0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  pVVar2 = (__return_storage_ptr__->m_data).m_data;
  pVVar2[1].m_data[1] = 0.0;
  pVVar2[1].m_data[2] = 0.0;
  lVar5 = 0;
  do {
    fVar10 = 1.0;
    if (lVar5 != 0) {
      fVar10 = 0.0;
    }
    (__return_storage_ptr__->m_data).m_data[0].m_data[lVar5] = fVar10;
    fVar10 = 1.0;
    if (lVar5 != 1) {
      fVar10 = 0.0;
    }
    (__return_storage_ptr__->m_data).m_data[1].m_data[lVar5] = fVar10;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  lVar5 = 0;
  pfVar3 = afStack_28;
  bVar9 = true;
  do {
    bVar4 = bVar9;
    lVar6 = 0;
    do {
      (__return_storage_ptr__->m_data).m_data[lVar5].m_data[lVar6] = pfVar3[lVar6 * 2];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    lVar5 = 1;
    pfVar3 = pfVar1;
    bVar9 = false;
  } while (bVar4);
  return __return_storage_ptr__;
}

Assistant:

tcu::Matrix<T, Cols, Rows> outerProduct (const tcu::Vector<T, Cols>& a, const tcu::Vector<T, Rows>& b)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = a[c] * b[r];

	return transpose(retVal); // to gl-form (column-major)
}